

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::benchmarkStarting(ConsoleReporter *this,BenchmarkInfo *info)

{
  TablePrinter *pTVar1;
  bool bVar2;
  iterator __begin1;
  string line;
  Column nameCol;
  iterator local_b0;
  string local_80;
  Column local_60;
  
  lazyPrintWithoutClosingBenchmarkTable(this);
  clara::TextFlow::Column::Column((Column *)&local_b0,&info->name);
  local_b0.m_len =
       (long)*(int *)(*(long *)&(((this->m_tablePrinter)._M_t.
                                  super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                                  .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl)
                                ->m_columnInfos).
                                super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                                ._M_impl + 0x20) - 2;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60.m_strings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_b0);
  local_60.m_width = local_b0.m_len;
  local_60.m_indent = local_b0.m_end;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b0);
  local_b0.m_stringIndex = 0;
  local_b0.m_pos = 0;
  local_b0.m_len = 0;
  local_b0.m_end = 0;
  local_b0.m_suffix = false;
  local_b0.m_column = &local_60;
  clara::TextFlow::Column::iterator::calcLength(&local_b0);
  if (local_b0.m_len == 0) {
    local_b0.m_stringIndex = local_b0.m_stringIndex + 1;
  }
  bVar2 = true;
  while (((local_b0.m_pos != 0 ||
          (local_b0.m_stringIndex !=
           (long)local_60.m_strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_60.m_strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5)) ||
         (local_b0.m_column != &local_60))) {
    clara::TextFlow::Column::iterator::operator*[abi_cxx11_(&local_80,&local_b0);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      pTVar1 = (this->m_tablePrinter)._M_t.
               super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
               ._M_t.
               super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
               .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
      operator<<(pTVar1);
      operator<<(pTVar1);
      operator<<(pTVar1);
    }
    pTVar1 = (this->m_tablePrinter)._M_t.
             super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
             _M_t.
             super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
             .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pTVar1->m_oss,local_80._M_dataplus._M_p,local_80._M_string_length);
    operator<<(pTVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    clara::TextFlow::Column::iterator::operator++(&local_b0);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.m_strings);
  return;
}

Assistant:

void ConsoleReporter::benchmarkStarting(BenchmarkInfo const& info) {
    lazyPrintWithoutClosingBenchmarkTable();

    auto nameCol = Column( info.name ).width( static_cast<std::size_t>( m_tablePrinter->columnInfos()[0].width - 2 ) );

    bool firstLine = true;
    for (auto line : nameCol) {
        if (!firstLine)
            (*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
        else
            firstLine = false;

        (*m_tablePrinter) << line << ColumnBreak();
    }
}